

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

bool __thiscall CTxMemPool::HasNoInputsOf(CTxMemPool *this,CTransaction *tx)

{
  uchar *puVar1;
  pointer pCVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  GenTxid local_59;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  do {
    uVar6 = (ulong)uVar5;
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68;
    if (uVar4 <= uVar6) break;
    local_59.m_is_wtxid = false;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)&pCVar2[uVar6].prevout.hash;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)&pCVar2[uVar6].prevout.hash + 8);
    puVar1 = (uchar *)((long)&pCVar2[uVar6].prevout.hash + 0x10);
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
    bVar3 = exists(this,&local_59);
    uVar5 = uVar5 + 1;
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4 <= uVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CTxMemPool::HasNoInputsOf(const CTransaction &tx) const
{
    for (unsigned int i = 0; i < tx.vin.size(); i++)
        if (exists(GenTxid::Txid(tx.vin[i].prevout.hash)))
            return false;
    return true;
}